

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

HRESULT Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::
        GenerateValidPointersMapHeader(LPCWSTR vpmFullPath)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  HRESULT HVar4;
  undefined4 *puVar5;
  PAL_FILE *stream;
  
  if (vpmFullPath == (LPCWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x194,"(vpmFullPath != nullptr)","vpmFullPath != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    vpmFullPath = (char16_t *)0x0;
  }
  stream = _wfopen(vpmFullPath,L"w");
  if (stream == (PAL_FILE *)0x0) {
    HVar4 = -0x7fffbffb;
  }
  else {
    iVar3 = PAL_fwprintf(stream,
                         L"//-------------------------------------------------------------------------------------------------------\n// Copyright (C) Microsoft. All rights reserved.\n// Licensed under the MIT license. See LICENSE.txt file in the project root for full license information.\n//-------------------------------------------------------------------------------------------------------\n// Generated via jshost -GenerateValidPointersMapHeader\n// Target platform: 64bit - amd64 & arm64\n#if USE_STATIC_VPM\n\n"
                        );
    if (iVar3 < 0) {
      HVar4 = -0x7fffbffb;
    }
    else {
      HVar4 = GenerateValidPointersMapForBlockType(stream);
      if (-1 < HVar4) {
        HVar4 = ValidPointersMap<MediumAllocationBlockAttributes>::
                GenerateValidPointersMapForBlockType(stream);
      }
      PAL_fwprintf(stream,L"#endif // USE_STATIC_VPM\n");
    }
    PAL_fclose(stream);
  }
  return HVar4;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMapHeader(LPCWSTR vpmFullPath)
{
    Assert(vpmFullPath != nullptr);
    HRESULT hr = E_FAIL;
    FILE * file = nullptr;

    if (_wfopen_s(&file, vpmFullPath, _u("w")) == 0 && file != nullptr)
    {
        const char16 * header =
            _u("//-------------------------------------------------------------------------------------------------------\n")
            _u("// Copyright (C) Microsoft. All rights reserved.\n")
            _u("// Licensed under the MIT license. See LICENSE.txt file in the project root for full license information.\n")
            _u("//-------------------------------------------------------------------------------------------------------\n")
            _u("// Generated via jshost -GenerateValidPointersMapHeader\n")
#if defined(TARGET_32)
            _u("// Target platforms: 32bit - x86 & arm\n")
#elif defined(TARGET_64)
            _u("// Target platform: 64bit - amd64 & arm64\n")
#else
#error "Platform is not handled"
#endif
            _u("#if USE_STATIC_VPM\n")
            _u("\n");
        if (fwprintf(file, header) >= 0)
        {
            hr = ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(file);
            if (SUCCEEDED(hr))
            {
                hr = ValidPointersMap<MediumAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(file);
            }

            fwprintf(file, _u("#endif // USE_STATIC_VPM\n"));
        }

        fclose(file);
    }

    return hr;
}